

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LinkedModelFile::SerializeWithCachedSizes
          (LinkedModelFile *this,CodedOutputStream *output)

{
  if (this->linkedmodelfilename_ != (StringParameter *)0x0 &&
      this != (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->linkedmodelfilename_->super_MessageLite,output);
  }
  if (this->linkedmodelsearchpath_ != (StringParameter *)0x0 &&
      this != (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->linkedmodelsearchpath_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void LinkedModelFile::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinkedModelFile)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringParameter linkedModelFileName = 1;
  if (this->has_linkedmodelfilename()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->linkedmodelfilename_, output);
  }

  // .CoreML.Specification.StringParameter linkedModelSearchPath = 2;
  if (this->has_linkedmodelsearchpath()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->linkedmodelsearchpath_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinkedModelFile)
}